

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_ping.c
# Opt level: O2

ssize_t tnt_ping(tnt_stream *s)

{
  uint64_t num;
  uint uVar1;
  char *pcVar2;
  ssize_t sVar3;
  char *pcVar4;
  undefined8 uStack_88;
  tnt_iheader hdr;
  undefined1 local_58 [8];
  iovec v [3];
  undefined4 uStack_1e;
  char len_prefix [9];
  char body [2];
  
  num = s->reqid;
  s->reqid = num + 1;
  hdr.header[0x18] = '\0';
  hdr._25_7_ = 0;
  hdr.header[0] = '\0';
  hdr.header[1] = '\0';
  hdr.header[2] = '\0';
  hdr.header[3] = '\0';
  hdr.header[4] = '\0';
  hdr.header[5] = '\0';
  hdr.header[6] = '\0';
  hdr.header[7] = '\0';
  hdr.header[8] = '\0';
  hdr.header[9] = '\0';
  hdr.header[10] = '\0';
  hdr.header[0xb] = '\0';
  hdr.header[0xc] = '\0';
  hdr.header[0xd] = '\0';
  hdr.header[0xe] = '\0';
  hdr.header[0xf] = '\0';
  hdr.header[0x10] = '\0';
  hdr.header[0x11] = '\0';
  hdr.header[0x12] = '\0';
  hdr.header[0x13] = '\0';
  hdr.header[0x14] = '\0';
  hdr.header[0x15] = '\0';
  hdr.header[0x16] = '\0';
  hdr.header[0x17] = '\0';
  uStack_88 = 0x1400082;
  hdr._24_8_ = mp_encode_uint((char *)((long)&uStack_88 + 4),num);
  v[0].iov_len = (size_t)&uStack_88;
  v[1].iov_base = (void *)(hdr._24_8_ + -v[0].iov_len);
  v[1].iov_len = (size_t)((char *)((long)register0x00000020 + -0x1b) + 1);
  len_prefix[1] = -0x80;
  v[2].iov_base = (void *)0x1;
  pcVar2 = (char *)((long)v[1].iov_base + 1);
  if ((ulong)pcVar2 >> 0x20 == 0) {
    pcVar4 = (char *)&stack0xffffffffffffffe2;
    uVar1 = (uint)pcVar2;
    stack0xffffffffffffffde =
         CONCAT44(uStack_1e,
                  uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
    v[2].iov_len._5_1_ = 0xce;
  }
  else {
    pcVar4 = (char *)((long)register0x00000020 + -0x1b) + 1;
    register0x00000000 =
         (ulong)pcVar2 >> 0x38 | ((ulong)pcVar2 & 0xff000000000000) >> 0x28 |
         ((ulong)pcVar2 & 0xff0000000000) >> 0x18 | ((ulong)pcVar2 & 0xff00000000) >> 8 |
         ((ulong)pcVar2 & 0xff000000) << 8 | ((ulong)pcVar2 & 0xff0000) << 0x18 |
         ((ulong)pcVar2 & 0xff00) << 0x28 | (long)pcVar2 << 0x38;
    v[2].iov_len._5_1_ = 0xcf;
  }
  local_58 = (undefined1  [8])((long)&v[2].iov_len + 5);
  v[0].iov_base = pcVar4 + -(long)local_58;
  sVar3 = (*s->writev)(s,(iovec *)local_58,3);
  return sVar3;
}

Assistant:

ssize_t
tnt_ping(struct tnt_stream *s)
{
	struct tnt_iheader hdr;
	struct iovec v[3]; int v_sz = 3;
	char *data = NULL;
	encode_header(&hdr, TNT_OP_PING, s->reqid++);
	v[1].iov_base = (void *)hdr.header;
	v[1].iov_len  = hdr.end - hdr.header;
	char body[2]; data = body;

	data = mp_encode_map(data, 0);
	v[2].iov_base = body;
	v[2].iov_len  = data - body;

	size_t package_len = 0;
	for (int i = 1; i < v_sz; ++i)
		package_len += v[i].iov_len;
	char len_prefix[9];
	char *len_end = mp_encode_luint32(len_prefix, package_len);
	v[0].iov_base = len_prefix;
	v[0].iov_len = len_end - len_prefix;
	return s->writev(s, v, v_sz);
}